

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O1

int parse_source_token_maybe_relative(Context_conflict2 *ctx,int relok)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  undefined2 uVar4;
  undefined3 uVar5;
  undefined1 uVar6;
  Token TVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  size_t __n;
  MOJOSHADER_shaderType MVar12;
  byte bVar13;
  uint uVar14;
  long lVar15;
  MOJOSHADER_shaderType MVar16;
  byte *__dest;
  bool bVar17;
  uint32 ui32;
  int regnum;
  RegisterType regtype;
  undefined4 local_4c;
  undefined1 local_48;
  MOJOSHADER_shaderType local_44;
  RegisterType local_40;
  int local_3c;
  long local_38;
  
  if (0xf < ctx->tokenbufpos) {
    failf(ctx,"%s","Too many tokens");
    return 0;
  }
  lVar15 = (long)ctx->tokenbufpos;
  ctx->tokenbufpos = ctx->tokenbufpos + 1;
  ctx->tokenbuf[lVar15] = 0;
  TVar7 = nexttoken(ctx);
  local_3c = relok;
  local_38 = lVar15;
  if (TVar7 == TOKEN_INT_LITERAL) {
    iVar8 = check_token(ctx,"1");
    if (iVar8 == 0) {
LAB_001515dd:
      if (ctx->pushedback != 0) goto LAB_00151ab6;
      ctx->pushedback = 1;
      bVar1 = 0;
      bVar17 = true;
      uVar10 = 0;
    }
    else {
      TVar7 = nexttoken(ctx);
      uVar10 = 0;
      if (TVar7 == 0x2d) {
        uVar10 = 6;
        goto LAB_001515d5;
      }
      failf(ctx,"%s","Unexpected token");
      bVar17 = true;
      bVar1 = 0;
    }
LAB_001515f7:
    bVar13 = 1;
    bVar2 = 0;
  }
  else {
    if (TVar7 != 0x2d) {
      if (TVar7 != 0x21) goto LAB_001515dd;
      uVar10 = 0xd;
LAB_001515d5:
      bVar1 = 1;
      bVar17 = false;
      goto LAB_001515f7;
    }
    bVar1 = 0;
    bVar17 = true;
    uVar10 = 0;
    bVar13 = 0;
    bVar2 = 1;
  }
  parse_register_name(ctx,&local_40,(int *)&local_44);
  if (ctx->tokenlen == 0) {
    uVar14 = 1;
    if (bVar13 != 0) {
      uVar14 = uVar10;
    }
    if (bVar17 || bVar13 != 0) goto LAB_00151722;
LAB_00151707:
    pcVar11 = "Incompatible source modifiers";
LAB_00151715:
    failf(ctx,"%s",pcVar11);
    uVar14 = uVar10;
  }
  else {
    iVar8 = check_token_segment(ctx,"_bias");
    if (iVar8 == 0) {
      iVar8 = check_token_segment(ctx,"_bx2");
      if (iVar8 == 0) {
        iVar8 = check_token_segment(ctx,"_x2");
        if (iVar8 == 0) {
          iVar8 = check_token_segment(ctx,"_dz");
          if ((iVar8 == 0) && (iVar8 = check_token_segment(ctx,"_db"), iVar8 == 0)) {
            iVar8 = check_token_segment(ctx,"_dw");
            if ((iVar8 != 0) || (iVar8 = check_token_segment(ctx,"_da"), iVar8 != 0)) {
              uVar14 = 10;
              goto LAB_00151701;
            }
            iVar8 = check_token_segment(ctx,"_abs");
            if (iVar8 != 0) {
              if (bVar17) {
                iVar8 = 0xc;
                goto LAB_001516a6;
              }
              goto LAB_00151707;
            }
            pcVar11 = "Invalid source modifier";
            goto LAB_00151715;
          }
          uVar14 = 9;
LAB_00151701:
          if ((bool)(bVar1 | bVar2)) goto LAB_00151707;
        }
        else {
          if (!bVar17) goto LAB_00151707;
          iVar8 = 8;
LAB_001516a6:
          uVar14 = iVar8 - (uint)bVar13;
        }
      }
      else {
        if (!bVar17) goto LAB_00151707;
        uVar14 = bVar13 ^ 5;
      }
    }
    else {
      if (!bVar17) goto LAB_00151707;
      uVar14 = bVar13 ^ 3;
    }
  }
LAB_00151722:
  TVar7 = nexttoken(ctx);
  if (TVar7 == 0x5b) {
    iVar8 = 2;
    if (local_3c == 0) {
      failf(ctx,"%s","Relative addressing not permitted here.");
      iVar8 = 1;
    }
    parse_source_token_maybe_relative(ctx,0);
    TVar7 = nexttoken(ctx);
    if (TVar7 == 0x2b) {
      if (local_44 != MOJOSHADER_TYPE_UNKNOWN) {
        failf(ctx,"%s","Relative addressing with explicit register number.");
      }
      local_4c = 0;
      TVar7 = nexttoken(ctx);
      if (((TVar7 != TOKEN_INT_LITERAL) || (iVar9 = ui32fromtoken(ctx,&local_4c), iVar9 == 0)) ||
         (ctx->tokenlen != 0)) {
        failf(ctx,"%s","Invalid relative addressing offset");
      }
      local_44 = local_44 + local_4c;
    }
    else {
      if (ctx->pushedback != 0) goto LAB_00151ab6;
      ctx->pushedback = 1;
    }
    TVar7 = nexttoken(ctx);
    MVar12 = 0x2000;
    if (TVar7 != 0x5d) {
      failf(ctx,"%s","Expected \']\'");
    }
  }
  else {
    if (ctx->pushedback != 0) goto LAB_00151ab6;
    ctx->pushedback = 1;
    iVar8 = 1;
    MVar12 = MOJOSHADER_TYPE_UNKNOWN;
  }
  TVar7 = nexttoken(ctx);
  if (TVar7 == 0x2e) {
    switch(local_40) {
    case REG_TYPE_DEPTHOUT:
    case REG_TYPE_CONSTBOOL:
    case REG_TYPE_LOOP:
      goto switchD_0015186a_caseD_9;
    case REG_TYPE_SAMPLER:
    case REG_TYPE_CONST2:
    case REG_TYPE_CONST3:
    case REG_TYPE_CONST4:
    case REG_TYPE_TEMPFLOAT16:
    case REG_TYPE_LABEL:
      goto switchD_0015186a_caseD_a;
    case REG_TYPE_MISCTYPE:
      MVar16 = local_44;
      break;
    case REG_TYPE_MAX:
      MVar16 = ctx->shader_type;
      break;
    default:
      if (local_40 != REG_TYPE_RASTOUT) goto switchD_0015186a_caseD_a;
      bVar17 = local_44 - MOJOSHADER_TYPE_PIXEL < 2;
      goto LAB_001518a4;
    }
    bVar17 = MVar16 == MOJOSHADER_TYPE_PIXEL;
LAB_001518a4:
    if (!bVar17) {
switchD_0015186a_caseD_a:
      TVar7 = nexttoken(ctx);
      bVar17 = false;
      MVar16 = MOJOSHADER_TYPE_UNKNOWN;
      if (TVar7 == TOKEN_IDENTIFIER) {
        __dest = (byte *)&local_4c;
        local_48 = 0;
        local_4c = 0;
        uVar10 = ctx->tokenlen;
        __n = 4;
        if (uVar10 < 4) {
          __n = (size_t)uVar10;
        }
        memcpy(__dest,ctx->token,__n);
        bVar3 = false;
        uVar5 = (undefined3)local_4c;
        uVar4 = (undefined2)local_4c;
        bVar17 = false;
        switch(uVar10) {
        case 1:
          bVar1 = (byte)local_4c;
          local_4c._0_3_ = CONCAT12((byte)local_4c,uVar4);
          local_4c = CONCAT13(bVar1,(undefined3)local_4c);
          local_4c._0_2_ = CONCAT11(bVar1,bVar1);
          bVar17 = bVar3;
          break;
        case 2:
          uVar6 = local_4c._1_1_;
          local_4c._0_3_ = CONCAT12(local_4c._1_1_,uVar4);
          local_4c = CONCAT13(uVar6,(undefined3)local_4c);
          bVar17 = bVar3;
          break;
        case 3:
          local_4c = CONCAT13(local_4c._2_1_,uVar5);
          bVar17 = bVar3;
          break;
        case 4:
          break;
        default:
          bVar17 = true;
        }
        local_48 = 0;
        lVar15 = 0;
        iVar9 = 0;
        uVar10 = 0;
        do {
          bVar1 = *__dest;
          if (bVar1 < 0x72) {
            if (bVar1 == 0x61) goto switchD_001519e9_caseD_77;
            if (bVar1 == 0x62) goto switchD_001519e9_caseD_7a;
            if (bVar1 == 0x67) goto switchD_001519e9_caseD_79;
switchD_001519e9_caseD_73:
            bVar17 = true;
          }
          else {
            switch(bVar1) {
            case 0x72:
            case 0x78:
              iVar9 = 0;
              break;
            default:
              goto switchD_001519e9_caseD_73;
            case 0x77:
switchD_001519e9_caseD_77:
              iVar9 = 3;
              break;
            case 0x79:
switchD_001519e9_caseD_79:
              iVar9 = 1;
              break;
            case 0x7a:
switchD_001519e9_caseD_7a:
              iVar9 = 2;
            }
          }
          uVar10 = uVar10 | iVar9 << ((byte)lVar15 & 0x1f);
          lVar15 = lVar15 + 2;
          __dest = __dest + 1;
        } while (lVar15 != 8);
        bVar17 = !bVar17;
        MVar16 = (uVar10 & 0xff) << 0x10;
      }
      goto LAB_001518c9;
    }
switchD_0015186a_caseD_9:
    MVar16 = MOJOSHADER_TYPE_UNKNOWN;
    failf(ctx,"%s","Swizzle specified for scalar register");
  }
  else {
    if (ctx->pushedback != 0) {
LAB_00151ab6:
      __assert_fail("!ctx->pushedback",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_assembler.c"
                    ,0x9f,"void pushback(Context *)");
    }
    ctx->pushedback = 1;
    MVar16 = 0xe40000;
  }
  bVar17 = true;
LAB_001518c9:
  if (!bVar17) {
    failf(ctx,"%s","Invalid swizzle");
  }
  ctx->tokenbuf[local_38] =
       (local_40 & (REG_TYPE_TEMPFLOAT16|REG_TYPE_COLOROUT)) << 8 |
       local_40 << 0x1c | MVar12 | uVar14 << 0x18 | local_44 & 0x7ff | MVar16 | 0x80000000;
  return iVar8;
}

Assistant:

static int parse_source_token_maybe_relative(Context *ctx, const int relok)
{
    int retval = 1;

    if (tokenbuf_overflow(ctx))
        return 0;

    // mark this now, so optional relative addressing token is placed second.
    uint32 *outtoken = &ctx->tokenbuf[ctx->tokenbufpos++];
    *outtoken = 0;

    SourceMod srcmod = SRCMOD_NONE;
    int negate = 0;
    Token token = nexttoken(ctx);

    if (token == ((Token) '!'))
        srcmod = SRCMOD_NOT;
    else if (token == ((Token) '-'))
        negate = 1;
    else if ( (token == TOKEN_INT_LITERAL) && (check_token(ctx, "1")) )
    {
        if (nexttoken(ctx) != ((Token) '-'))
            fail(ctx, "Unexpected token");
        else
            srcmod = SRCMOD_COMPLEMENT;
    } // else
    else
    {
        pushback(ctx);
    } // else

    RegisterType regtype;
    int regnum;
    parse_register_name(ctx, &regtype, &regnum);

    if (ctx->tokenlen == 0)
    {
        if (negate)
            set_source_mod(ctx, negate, SRCMOD_NONE, SRCMOD_NEGATE, &srcmod);
    } // if
    else
    {
        assert(ctx->tokenlen > 0);
        if (check_token_segment(ctx, "_bias"))
            set_source_mod(ctx, negate, SRCMOD_BIAS, SRCMOD_BIASNEGATE, &srcmod);
        else if (check_token_segment(ctx, "_bx2"))
            set_source_mod(ctx, negate, SRCMOD_SIGN, SRCMOD_SIGNNEGATE, &srcmod);
        else if (check_token_segment(ctx, "_x2"))
            set_source_mod(ctx, negate, SRCMOD_X2, SRCMOD_X2NEGATE, &srcmod);
        else if (check_token_segment(ctx, "_dz"))
            set_source_mod(ctx, negate, SRCMOD_DZ, SRCMOD_NONE, &srcmod);
        else if (check_token_segment(ctx, "_db"))
            set_source_mod(ctx, negate, SRCMOD_DZ, SRCMOD_NONE, &srcmod);
        else if (check_token_segment(ctx, "_dw"))
            set_source_mod(ctx, negate, SRCMOD_DW, SRCMOD_NONE, &srcmod);
        else if (check_token_segment(ctx, "_da"))
            set_source_mod(ctx, negate, SRCMOD_DW, SRCMOD_NONE, &srcmod);
        else if (check_token_segment(ctx, "_abs"))
            set_source_mod(ctx, negate, SRCMOD_ABS, SRCMOD_ABSNEGATE, &srcmod);
        else
            fail(ctx, "Invalid source modifier");
    } // else

    uint32 relative = 0;
    if (nexttoken(ctx) != ((Token) '['))
        pushback(ctx);  // not relative addressing?
    else
    {
        if (!relok)
            fail(ctx, "Relative addressing not permitted here.");
        else
            retval++;

        parse_source_token_maybe_relative(ctx, 0);
        relative = 1;

        if (nexttoken(ctx) != ((Token) '+'))
            pushback(ctx);
        else
        {
            // !!! FIXME: maybe c3[a0.x + 5] is legal and becomes c[a0.x + 8] ?
            if (regnum != 0)
                fail(ctx, "Relative addressing with explicit register number.");

            uint32 ui32 = 0;
            if ( (nexttoken(ctx) != TOKEN_INT_LITERAL) ||
                 (!ui32fromtoken(ctx, &ui32)) ||
                 (ctx->tokenlen != 0) )
            {
                fail(ctx, "Invalid relative addressing offset");
            } // if
            regnum += (int) ui32;
        } // else

        if (nexttoken(ctx) != ((Token) ']'))
            fail(ctx, "Expected ']'");
    } // else

    int invalid_swizzle = 0;
    uint32 swizzle = 0;
    if (nexttoken(ctx) != ((Token) '.'))
    {
        swizzle = 0xE4;  // 0xE4 == 11100100 ... 0 1 2 3. No swizzle.
        pushback(ctx);  // no explicit writemask; do full mask.
    } // if
    else if (scalar_register(ctx->shader_type, regtype, regnum))
        fail(ctx, "Swizzle specified for scalar register");
    else if (nexttoken(ctx) != TOKEN_IDENTIFIER)
        invalid_swizzle = 1;
    else
    {
        char tokenbytes[5] = { '\0', '\0', '\0', '\0', '\0' };
        const unsigned int tokenlen = ctx->tokenlen;
        memcpy(tokenbytes, ctx->token, ((tokenlen < 4) ? tokenlen : 4));

        // deal with shortened form (.x = .xxxx, etc).
        if (tokenlen == 1)
            tokenbytes[1] = tokenbytes[2] = tokenbytes[3] = tokenbytes[0];
        else if (tokenlen == 2)
            tokenbytes[2] = tokenbytes[3] = tokenbytes[1];
        else if (tokenlen == 3)
            tokenbytes[3] = tokenbytes[2];
        else if (tokenlen != 4)
            invalid_swizzle = 1;
        tokenbytes[4] = '\0';

        uint32 val = 0;
        int i;
        for (i = 0; i < 4; i++)
        {
            const int component = (int) tokenbytes[i];
            switch (component)
            {
                case 'r': case 'x': val = 0; break;
                case 'g': case 'y': val = 1; break;
                case 'b': case 'z': val = 2; break;
                case 'a': case 'w': val = 3; break;
                default: invalid_swizzle = 1; break;
            } // switch
            swizzle |= (val << (i * 2));
        } // for
    } // else

    if (invalid_swizzle)
        fail(ctx, "Invalid swizzle");

    *outtoken = ( ((((uint32) 1)) << 31) |
                  ((((uint32) regnum) & 0x7ff) << 0) |
                  ((((uint32) relative) & 0x1) << 13) |
                  ((((uint32) swizzle) & 0xFF) << 16) |
                  ((((uint32) srcmod) & 0xF) << 24) |
                  ((((uint32) regtype) & 0x7) << 28) |
                  ((((uint32) regtype) & 0x18) << 8) );

    return retval;
}